

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::SRGBTestCase::iterate(SRGBTestCase *this)

{
  FragmentShaderParameters *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  pointer *ppUVar1;
  pointer *pppSVar2;
  TextureType TVar3;
  undefined4 uVar4;
  ShaderSamplingType SVar5;
  FunctionParameters FVar6;
  pointer puVar7;
  pointer puVar8;
  pointer pFVar9;
  ContextInfo *log;
  ShaderProgram *pSVar10;
  UniformData *__last;
  UniformData *__first;
  long lVar11;
  pointer pUVar12;
  pointer pUVar13;
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
  *p_Var14;
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
  *this_02;
  pointer ppSVar15;
  SRGBTestTexture *this_03;
  pointer ppSVar16;
  TestContext *this_04;
  PtrData<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> data;
  PtrData<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> data_00;
  pointer pcVar17;
  __type_conflict _Var18;
  int iVar19;
  deUint32 dVar20;
  undefined4 uVar21;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  SRGBTestProgram *pSVar22;
  MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *this_05;
  ostream *poVar23;
  ShaderProgram *this_06;
  size_t sVar24;
  ulong uVar25;
  UniformData *__result;
  UniformData *pUVar26;
  long lVar27;
  pointer ppSVar28;
  undefined4 extraout_var_03;
  TestError *pTVar29;
  invalid_argument *this_07;
  size_t renderBufferIdx_1;
  allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData> *__alloc;
  long lVar30;
  allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData> *paVar31;
  code *pcVar32;
  int output;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  char *pcVar33;
  pointer_____offset_0x10___ *ppuVar34;
  size_t renderBufferIdx;
  ulong uVar35;
  int outputIdx;
  int iVar36;
  ulong uVar37;
  size_t idx_1;
  long lVar38;
  ShaderProgram *in_stack_fffffffffffff788;
  SRGBTestCase *pSVar39;
  SRGBTestCase *__n;
  ShaderSamplingType local_864;
  ShaderSamplingType local_854;
  GLenum type;
  ShaderProgramInfo buildInfo;
  GLint size;
  vector<unsigned_int,_std::allocator<unsigned_int>_> renderBufferTargets;
  ostringstream source;
  vector<char,_std::allocator<char>_> uniformName;
  GLint maxLen;
  GLint activeUniforms;
  
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])();
  if (this->m_samplingGroup == SHADERSAMPLINGGROUP_TEXTURE) {
    local_854 = TEXTURESAMPLING_TEXELFETCH;
    local_864 = TEXTURESAMPLING_TEXTURE;
  }
  else if (this->m_samplingGroup == SHADERSAMPLINGGROUP_TEXEL_FETCH) {
    local_854 = TEXTURESAMPLING_TEXELFETCH_END;
    local_864 = TEXTURESAMPLING_TEXELFETCH;
  }
  else {
    local_864 = ~TEXTURESAMPLING_TEXTURE;
    local_854 = local_864;
  }
  iVar19 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar30 = CONCAT44(extraout_var,iVar19);
  (**(code **)(lVar30 + 0x708))(1,&this->m_vaoID);
  (**(code **)(lVar30 + 0xd8))(this->m_vaoID);
  (**(code **)(lVar30 + 0x6c8))(1,&this->m_vertexDataID);
  (**(code **)(lVar30 + 0x40))(0x8892,this->m_vertexDataID);
  (**(code **)(lVar30 + 0x150))
            (0x8892,0x78,
             Functional::(anonymous_namespace)::SRGBTestCase::initVertexData()::squareVertexData,
             0x88e4);
  iVar36 = 0;
  (**(code **)(lVar30 + 0x19f0))(0,3,0x1406,0,0x14,0);
  (**(code **)(lVar30 + 0x610))(0);
  (**(code **)(lVar30 + 0x19f0))(1,2,0x1406,0,0x14,0xc);
  (**(code **)(lVar30 + 0x610))(1);
  (**(code **)(lVar30 + 0xd8))(0);
  (**(code **)(lVar30 + 0x40))(0x8892,0);
  iVar19 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar30 = CONCAT44(extraout_var_00,iVar19);
  iVar19 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  uVar21 = *(undefined4 *)CONCAT44(extraout_var_01,iVar19);
  iVar19 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  if (this->m_resultOutputTotal == 0) {
    this_07 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_07,"SRGBTestExecutor must have at least 1 rendered result");
    ppuVar34 = (pointer_____offset_0x10___ *)&std::invalid_argument::typeinfo;
    pcVar32 = std::invalid_argument::~invalid_argument;
  }
  else {
    uVar4 = *(undefined4 *)(CONCAT44(extraout_var_02,iVar19) + 4);
    (**(code **)(lVar30 + 0x78))
              (0x8d40,(((this->m_framebuffer).
                        super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                        .m_data.ptr)->super_ObjectWrapper).m_object);
    this_01 = &this->m_renderBufferList;
    for (; iVar36 < this->m_resultOutputTotal; iVar36 = iVar36 + 1) {
      renderBufferTargets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(renderBufferTargets.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._4_4_,0xffffffff);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (this_01,(value_type_conflict4 *)&renderBufferTargets);
    }
    lVar38 = 0;
    pSVar39 = this;
    for (uVar35 = 0;
        puVar7 = (this->m_renderBufferList).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start,
        uVar35 < (ulong)((long)(this->m_renderBufferList).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar7 >> 2);
        uVar35 = uVar35 + 1) {
      (**(code **)(lVar30 + 0x6e8))(1,(long)puVar7 + lVar38);
      (**(code **)(lVar30 + 0xa0))
                (0x8d41,(this->m_renderBufferList).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar35]);
      pcVar32 = *(code **)(lVar30 + 0x1238);
      dVar20 = glu::getInternalFormat(this->m_resultTextureFormat);
      (*pcVar32)(0x8d41,dVar20,uVar21,uVar4);
      (**(code **)(lVar30 + 0x688))
                (0x8d40,(int)uVar35 + 0x8ce0,0x8d41,
                 (this->m_renderBufferList).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar35]);
      dVar20 = (**(code **)(lVar30 + 0x800))();
      glu::checkError(dVar20,"Create and setup renderbuffer object",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSRGBDecodeTests.cpp"
                      ,0x564);
      lVar38 = lVar38 + 4;
    }
    iVar19 = (**(code **)(lVar30 + 0x170))(0x8d40);
    if (iVar19 == 0x8cd5) {
      __n = pSVar39;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&renderBufferTargets,
                 (long)(pSVar39->m_renderBufferList).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(pSVar39->m_renderBufferList).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2,(allocator_type *)&source);
      puVar7 = (pSVar39->m_renderBufferList).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      puVar8 = (pSVar39->m_renderBufferList).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar38 = 0; (long)puVar7 - (long)puVar8 >> 2 != lVar38; lVar38 = lVar38 + 1) {
        renderBufferTargets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar38] = (int)lVar38 + 0x8ce0;
      }
      (**(code **)(lVar30 + 0x560))
                ((ulong)((long)renderBufferTargets.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)renderBufferTargets.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 2);
      dVar20 = (**(code **)(lVar30 + 0x800))();
      glu::checkError(dVar20,"glDrawBuffer()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSRGBDecodeTests.cpp"
                      ,0x56e);
      (**(code **)(lVar30 + 0x78))(0x8d40,0);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&renderBufferTargets.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      do {
        if ((int)local_854 <= (int)local_864) {
          return STOP;
        }
        lVar30 = 0;
        while( true ) {
          pFVar9 = (__n->m_shaderParametersList).
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FragmentShaderParameters,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FragmentShaderParameters>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((int)((ulong)((long)(__n->m_shaderParametersList).
                                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FragmentShaderParameters,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FragmentShaderParameters>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar9) >> 7)
              <= lVar30) break;
          pFVar9[lVar30].samplingType = local_864;
          pSVar39 = __n;
          pSVar22 = (SRGBTestProgram *)operator_new(0xf8);
          pSVar22->m_context = (Context *)(__n->super_TestCase).m_context;
          this_05 = &pSVar22->m_program;
          (pSVar22->m_program).
          super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.m_data.ptr =
               (ShaderProgram *)0x0;
          this_00 = &pSVar22->m_shaderFragmentParameters;
          FragmentShaderParameters::FragmentShaderParameters(this_00,pFVar9 + lVar30);
          (pSVar22->m_shaderVertex)._M_dataplus._M_p = (pointer)&(pSVar22->m_shaderVertex).field_2;
          (pSVar22->m_shaderVertex)._M_string_length = 0;
          (pSVar22->m_shaderVertex).field_2._M_local_buf[0] = '\0';
          (pSVar22->m_shaderFragment)._M_dataplus._M_p =
               (pointer)&(pSVar22->m_shaderFragment).field_2;
          (pSVar22->m_shaderFragment)._M_string_length = 0;
          (pSVar22->m_shaderFragment).field_2._M_local_buf[0] = '\0';
          (pSVar22->m_uniformDataList).
          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>_>
          ._M_impl.super__Vector_impl_data._M_start = 0;
          (pSVar22->m_uniformDataList).
          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          *(undefined8 *)
           ((long)&(pSVar22->m_uniformDataList).
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 2) = 0;
          *(undefined8 *)
           ((long)&(pSVar22->m_uniformDataList).
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 2) = 0;
          lVar38 = (**(code **)(*(long *)((((SRGBTestProgram *)pSVar22->m_context)->m_program).
                                          super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                                          .m_data.ptr)->m_shaders + 0x18))();
          log = ((SRGBTestProgram *)pSVar22->m_context)->m_context->m_contextInfo;
          buildInfo.program.infoLog._M_dataplus._M_p = (pointer)&buildInfo.program.infoLog.field_2;
          buildInfo.program.infoLog._M_string_length = 0;
          buildInfo.program.infoLog.field_2._M_local_buf[0] = '\0';
          buildInfo.program.linkOk = false;
          buildInfo.shaders.super__Vector_base<glu::ShaderInfo,_std::allocator<glu::ShaderInfo>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          buildInfo.shaders.super__Vector_base<glu::ShaderInfo,_std::allocator<glu::ShaderInfo>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          buildInfo.program.linkTimeUs = 0;
          buildInfo.shaders.super__Vector_base<glu::ShaderInfo,_std::allocator<glu::ShaderInfo>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          std::__cxx11::string::assign((char *)&pSVar22->m_shaderVertex);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&source);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&uniformName);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&activeUniforms);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&maxLen);
          poVar23 = std::operator<<((ostream *)&source,"#version 310 es \n");
          std::operator<<(poVar23,"in mediump vec2 vs_aTexCoord; \n");
          __n = pSVar39;
          for (iVar19 = 0; iVar19 < (int)this_00->outputTotal; iVar19 = iVar19 + 1) {
            poVar23 = std::operator<<((ostream *)&source,"layout (location = ");
            poVar23 = (ostream *)std::ostream::operator<<(poVar23,iVar19);
            poVar23 = std::operator<<(poVar23,") out mediump vec4 fs_aColor");
            poVar23 = (ostream *)std::ostream::operator<<(poVar23,iVar19);
            std::operator<<(poVar23,"; \n");
          }
          for (iVar19 = 0; iVar19 < (int)(pSVar22->m_shaderFragmentParameters).uniformTotal;
              iVar19 = iVar19 + 1) {
            poVar23 = std::operator<<((ostream *)&source,"uniform sampler2D uTexture");
            poVar23 = (ostream *)std::ostream::operator<<(poVar23,iVar19);
            std::operator<<(poVar23,"; \n");
          }
          if ((pSVar22->m_shaderFragmentParameters).hasFunction != false) {
            std::operator<<((ostream *)&source,
                            (string *)&(pSVar22->m_shaderFragmentParameters).functionImplementation)
            ;
          }
          poVar23 = std::operator<<((ostream *)&source,"void main () \n");
          std::operator<<(poVar23,"{ \n");
          for (iVar19 = 0; iVar19 < (int)(pSVar22->m_shaderFragmentParameters).uniformTotal;
              iVar19 = iVar19 + 1) {
            SVar5 = (pSVar22->m_shaderFragmentParameters).samplingType;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&renderBufferTargets);
            poVar23 = std::operator<<((ostream *)&renderBufferTargets,"\tmediump vec4 texelColor");
            poVar23 = (ostream *)std::ostream::operator<<(poVar23,iVar19);
            std::operator<<(poVar23," = ");
            switch(SVar5) {
            case TEXTURESAMPLING_TEXTURE:
              poVar23 = std::operator<<((ostream *)&renderBufferTargets,"texture(uTexture");
              poVar23 = (ostream *)std::ostream::operator<<(poVar23,iVar19);
              pcVar33 = ", vs_aTexCoord); \n";
              break;
            case TEXTURESAMPLING_TEXTURE_LOD:
              poVar23 = std::operator<<((ostream *)&renderBufferTargets,"textureLod(uTexture");
              poVar23 = (ostream *)std::ostream::operator<<(poVar23,iVar19);
              pcVar33 = ", vs_aTexCoord, 0.0); \n";
              break;
            case TEXTURESAMPLING_TEXTURE_GRAD:
              poVar23 = std::operator<<((ostream *)&renderBufferTargets,"textureGrad(uTexture");
              poVar23 = (ostream *)std::ostream::operator<<(poVar23,iVar19);
              pcVar33 = ", vs_aTexCoord, vec2(0.0, 0.0), vec2(0.0, 0.0)); \n";
              break;
            case TEXTURESAMPLING_TEXTURE_OFFSET:
              poVar23 = std::operator<<((ostream *)&renderBufferTargets,"textureOffset(uTexture");
              poVar23 = (ostream *)std::ostream::operator<<(poVar23,iVar19);
              pcVar33 = ", vs_aTexCoord, ivec2(0.0, 0.0)); \n";
              break;
            case TEXTURESAMPLING_TEXTURE_PROJ:
              poVar23 = std::operator<<((ostream *)&renderBufferTargets,"textureProj(uTexture");
              poVar23 = (ostream *)std::ostream::operator<<(poVar23,iVar19);
              pcVar33 = ", vec3(vs_aTexCoord, 1.0)); \n";
              break;
            case TEXTURESAMPLING_TEXELFETCH:
              poVar23 = std::operator<<((ostream *)&renderBufferTargets,"texelFetch(uTexture");
              poVar23 = (ostream *)std::ostream::operator<<(poVar23,iVar19);
              pcVar33 = ", ivec2(vs_aTexCoord), 0); \n";
              break;
            case TEXTURESAMPLING_TEXELFETCH_OFFSET:
              poVar23 = std::operator<<((ostream *)&renderBufferTargets,"texelFetchOffset(uTexture")
              ;
              poVar23 = (ostream *)std::ostream::operator<<(poVar23,iVar19);
              pcVar33 = ", ivec2(vs_aTexCoord), 0, ivec2(0.0, 0.0)); \n";
              break;
            default:
              goto switchD_01260d04_default;
            }
            std::operator<<(poVar23,pcVar33);
switchD_01260d04_default:
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&renderBufferTargets);
            std::operator<<((ostream *)&source,(string *)&size);
            std::__cxx11::string::~string((string *)&size);
          }
          if ((pSVar22->m_shaderFragmentParameters).hasFunction == false) {
            for (iVar19 = 0; iVar19 < (int)this_00->outputTotal; iVar19 = iVar19 + 1) {
              poVar23 = std::operator<<((ostream *)&maxLen,"\tfs_aColor");
              poVar23 = (ostream *)std::ostream::operator<<(poVar23,iVar19);
              poVar23 = std::operator<<(poVar23," = texelColor");
              poVar23 = (ostream *)std::ostream::operator<<(poVar23,iVar19);
              std::operator<<(poVar23,"; \n");
            }
          }
          else {
            FVar6 = (pSVar22->m_shaderFragmentParameters).functionParameters;
            pcVar33 = "(texelColor0)";
            if (FVar6 == FUNCTIONPARAMETERS_ONE) {
LAB_01260e71:
              std::operator<<((ostream *)&activeUniforms,pcVar33);
            }
            else if (FVar6 == FUNCTIONPARAMETERS_TWO) {
              pcVar33 = "(texelColor0, texelColor1)";
              goto LAB_01260e71;
            }
            poVar23 = std::operator<<((ostream *)&maxLen,"\tfs_aColor0 = ");
            poVar23 = std::operator<<(poVar23,(string *)
                                              &(pSVar22->m_shaderFragmentParameters).functionName);
            std::__cxx11::stringbuf::str();
            poVar23 = std::operator<<(poVar23,(string *)&renderBufferTargets);
            std::operator<<(poVar23,"; \n");
            std::__cxx11::string::~string((string *)&renderBufferTargets);
          }
          std::__cxx11::stringbuf::str();
          std::operator<<((ostream *)&source,(string *)&renderBufferTargets);
          std::__cxx11::string::~string((string *)&renderBufferTargets);
          std::operator<<((ostream *)&source,"} \n");
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::operator=
                    ((string *)&pSVar22->m_shaderFragment,(string *)&renderBufferTargets);
          std::__cxx11::string::~string((string *)&renderBufferTargets);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&maxLen);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&activeUniforms);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uniformName);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&source);
          this_06 = (ShaderProgram *)operator_new(0xd0);
          pSVar10 = (((SRGBTestProgram *)pSVar22->m_context)->m_program).
                    super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.
                    m_data.ptr;
          glu::makeVtxFragSources
                    ((ProgramSources *)&renderBufferTargets,&pSVar22->m_shaderVertex,
                     &pSVar22->m_shaderFragment);
          glu::ShaderProgram::ShaderProgram
                    (this_06,(RenderContext *)pSVar10,(ProgramSources *)&renderBufferTargets);
          source.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
               (_func_int **)0x0;
          data._8_8_ = __n;
          data.ptr = in_stack_fffffffffffff788;
          de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
          assignData(&this_05->
                      super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>,
                     data);
          de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
          ~UniqueBase((UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *)
                      &source);
          glu::ProgramSources::~ProgramSources((ProgramSources *)&renderBufferTargets);
          pSVar10 = (this_05->
                    super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>).
                    m_data.ptr;
          if ((pSVar10->m_program).m_info.linkOk == false) {
            pTVar29 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar29,"Failed to compile shaders and link program",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSRGBDecodeTests.cpp"
                       ,0x292);
            __cxa_throw(pTVar29,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
          (**(code **)(lVar38 + 0x9d8))
                    ((pSVar10->m_program).m_program,0x8b87,(ostringstream *)&maxLen);
          (**(code **)(lVar38 + 0x9d8))
                    ((((this_05->
                       super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                       ).m_data.ptr)->m_program).m_program,0x8b86,&activeUniforms);
          std::vector<char,_std::allocator<char>_>::vector
                    (&uniformName,(long)maxLen,(allocator_type *)&renderBufferTargets);
          iVar19 = 0;
          while( true ) {
            if (activeUniforms <= iVar19) break;
            in_stack_fffffffffffff788 =
                 (ShaderProgram *)
                 uniformName.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
            (**(code **)(lVar38 + 0x750))
                      ((((this_05->
                         super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                         ).m_data.ptr)->m_program).m_program,iVar19,maxLen,0,&size,&type);
            uVar21 = (**(code **)(lVar38 + 0xb48))
                               ((((this_05->
                                  super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                                  ).m_data.ptr)->m_program).m_program,
                                uniformName.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
            pcVar17 = uniformName.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start;
            sVar24 = strlen(uniformName.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
            source.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                 (_func_int **)&source.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10
            ;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&source,pcVar17,pcVar17 + sVar24);
            renderBufferTargets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(renderBufferTargets.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,uVar21);
            std::__cxx11::string::string
                      ((string *)
                       &renderBufferTargets.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish,(string *)&source);
            std::__cxx11::string::~string((string *)&source);
            __last = (pSVar22->m_uniformDataList).
                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            if (__last == (pSVar22->m_uniformDataList).
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              __first = (pSVar22->m_uniformDataList).
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if ((long)__last - (long)__first == 0x7fffffffffffffe0) {
                std::__throw_length_error("vector::_M_realloc_insert");
              }
              uVar25 = ((long)__last - (long)__first) / 0x30;
              uVar35 = uVar25;
              if (__last == __first) {
                uVar35 = 1;
              }
              __alloc = (allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData> *)
                        (uVar35 + uVar25);
              if ((allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData> *)
                  0x2aaaaaaaaaaaaa9 < __alloc) {
                __alloc = (allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData> *
                          )0x2aaaaaaaaaaaaaa;
              }
              paVar31 = (allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData> *)
                        0x2aaaaaaaaaaaaaa;
              if (!CARRY8(uVar35,uVar25)) {
                paVar31 = __alloc;
              }
              if (paVar31 ==
                  (allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData> *)0x0) {
                __result = (UniformData *)0x0;
              }
              else {
                __result = (UniformData *)operator_new((long)paVar31 * 0x30);
              }
              UniformData::UniformData(__result + uVar25,(UniformData *)&renderBufferTargets);
              pUVar26 = std::
                        __uninitialized_move_if_noexcept_a<deqp::gles31::Functional::(anonymous_namespace)::UniformData*,deqp::gles31::Functional::(anonymous_namespace)::UniformData*,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>>
                                  (__first,__last,__result,__alloc);
              pUVar26 = std::
                        __uninitialized_move_if_noexcept_a<deqp::gles31::Functional::(anonymous_namespace)::UniformData*,deqp::gles31::Functional::(anonymous_namespace)::UniformData*,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>>
                                  (__last,__last,pUVar26 + 1,__alloc);
              std::_Destroy<deqp::gles31::Functional::(anonymous_namespace)::UniformData*>
                        (__first,__last);
              lVar27 = (long)(pSVar22->m_uniformDataList).
                             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)__first;
              std::
              _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>_>
              ::_M_deallocate((_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>_>
                               *)__first,(pointer)(lVar27 / 0x30),lVar27 % 0x30);
              (pSVar22->m_uniformDataList).
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>_>
              ._M_impl.super__Vector_impl_data._M_start = __result;
              (pSVar22->m_uniformDataList).
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>_>
              ._M_impl.super__Vector_impl_data._M_finish = pUVar26;
              (pSVar22->m_uniformDataList).
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + (long)paVar31;
            }
            else {
              UniformData::UniformData(__last,(UniformData *)&renderBufferTargets);
              ppUVar1 = &(pSVar22->m_uniformDataList).
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppUVar1 = *ppUVar1 + 1;
            }
            std::__cxx11::string::~string
                      ((string *)
                       &renderBufferTargets.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish);
            iVar19 = iVar19 + 1;
          }
          glu::ProgramInfo::operator=
                    (&buildInfo.program,
                     &(((this_05->
                        super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                        ).m_data.ptr)->m_program).m_info);
          for (lVar38 = 0; lVar38 != 0x30; lVar38 = lVar38 + 0x18) {
            glu::ShaderInfo::ShaderInfo
                      ((ShaderInfo *)&renderBufferTargets,
                       (ShaderInfo *)
                       (**(long **)((long)&((this_05->
                                            super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                                            ).m_data.ptr)->m_shaders[0].
                                           super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start + lVar38) +
                       0x10));
            std::vector<glu::ShaderInfo,_std::allocator<glu::ShaderInfo>_>::push_back
                      (&buildInfo.shaders,(ShaderInfo *)&renderBufferTargets);
            glu::ShaderInfo::~ShaderInfo((ShaderInfo *)&renderBufferTargets);
          }
          glu::operator<<((TestLog *)log,&buildInfo);
          std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                    (&uniformName.super__Vector_base<char,_std::allocator<char>_>);
          glu::ShaderProgramInfo::~ShaderProgramInfo(&buildInfo);
          pFVar9 = (__n->m_shaderParametersList).
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FragmentShaderParameters,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FragmentShaderParameters>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (pFVar9[lVar30].blendRequired == BLENDING_REQUIRED) {
            pSVar22->m_blendRequired = true;
          }
          if (pFVar9[lVar30].toggleRequired == TOGGLING_REQUIRED) {
            pSVar22->m_toggleRequired = true;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&renderBufferTargets,&pFVar9[lVar30].uniformsToToggle);
            for (lVar38 = 0;
                lVar38 < (int)((ulong)((long)renderBufferTargets.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)renderBufferTargets.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 5);
                lVar38 = lVar38 + 1) {
              __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (renderBufferTargets.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar38 * 8);
              lVar27 = 8;
              uVar35 = 0;
              while( true ) {
                lVar11 = *(long *)&(pSVar22->m_uniformDataList).
                                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>_>
                                   ._M_impl.super__Vector_impl_data;
                if ((ulong)(((long)(pSVar22->m_uniformDataList).
                                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - lVar11) / 0x30) <=
                    uVar35) {
                  pTVar29 = (TestError *)__cxa_allocate_exception(0x38);
                  tcu::TestError::TestError
                            (pTVar29,
                             "Error: If name correctly requested then glGetActiveUniforms() returned active uniform data incorrectly"
                             ,(char *)0x0,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSRGBDecodeTests.cpp"
                             ,0x2e5);
                  goto LAB_012617e3;
                }
                _Var18 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)(lVar11 + lVar27),__rhs);
                if (_Var18) break;
                uVar35 = uVar35 + 1;
                lVar27 = lVar27 + 0x30;
              }
              pUVar12 = (pSVar22->m_uniformDataList).
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              iVar19 = *(int *)((long)pUVar12 + lVar27 + -8);
              if ((((long)iVar19 < 0) ||
                  (pUVar13 = (pSVar22->m_uniformDataList).
                             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>_>
                             ._M_impl.super__Vector_impl_data._M_finish, pUVar12 == pUVar13)) ||
                 ((int)(((long)pUVar13 - (long)pUVar12) / 0x30) < iVar19)) {
                pTVar29 = (TestError *)__cxa_allocate_exception(0x38);
                tcu::TestError::TestError
                          (pTVar29,
                           "Error: Uniform location not found. glGetActiveUniforms returned uniforms incorrectly "
                           ,(char *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSRGBDecodeTests.cpp"
                           ,0x2c8);
LAB_012617e3:
                __cxa_throw(pTVar29,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
              }
              pUVar12[iVar19].toggleDecode = true;
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&renderBufferTargets);
          }
          p_Var14 = (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
                     *)(__n->m_shaderProgramList).
                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
          if (p_Var14 ==
              (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
               *)(__n->m_shaderProgramList).
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            this_02 = (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
                       *)(__n->m_shaderProgramList).
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            sVar24 = (long)p_Var14 - (long)this_02;
            if (sVar24 == 0x7ffffffffffffff8) {
              std::__throw_length_error("vector::_M_realloc_insert");
            }
            uVar25 = (long)sVar24 >> 3;
            uVar35 = uVar25;
            if (p_Var14 == this_02) {
              uVar35 = 1;
            }
            uVar37 = uVar35 + uVar25;
            if (0xffffffffffffffe < uVar37) {
              uVar37 = 0xfffffffffffffff;
            }
            if (CARRY8(uVar35,uVar25)) {
              uVar37 = 0xfffffffffffffff;
            }
            if (uVar37 == 0) {
              ppSVar28 = (pointer)0x0;
            }
            else {
              ppSVar28 = (pointer)operator_new(uVar37 * 8);
            }
            ppSVar28[uVar25] = pSVar22;
            if (0 < (long)sVar24) {
              memmove(ppSVar28,this_02,sVar24);
            }
            std::
            _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
            ::_M_deallocate(this_02,(pointer)((long)(__n->m_shaderProgramList).
                                                                                                        
                                                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              - (long)this_02 >> 3),(size_t)__n);
            (__n->m_shaderProgramList).
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
            ._M_impl.super__Vector_impl_data._M_start = ppSVar28;
            (__n->m_shaderProgramList).
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)((long)ppSVar28 + sVar24 + 8);
            (__n->m_shaderProgramList).
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = ppSVar28 + uVar37;
          }
          else {
            (p_Var14->_M_impl).super__Vector_impl_data._M_start = (pointer)pSVar22;
            pppSVar2 = &(__n->m_shaderProgramList).
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppSVar2 = *pppSVar2 + 1;
          }
          lVar30 = lVar30 + 1;
        }
        pSVar39 = __n;
        for (uVar35 = 0;
            ppSVar15 = (pSVar39->m_textureSourceList).
                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
                       ._M_impl.super__Vector_impl_data._M_start,
            uVar35 < (ulong)((long)(pSVar39->m_textureSourceList).
                                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar15 >> 3)
            ; uVar35 = uVar35 + 1) {
          glu::Texture2D::upload(&ppSVar15[uVar35]->m_source);
          this_03 = (pSVar39->m_textureSourceList).
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar35];
          iVar19 = (*this_03->m_context->m_renderCtx->_vptr_RenderContext[3])();
          lVar30 = CONCAT44(extraout_var_03,iVar19);
          (**(code **)(lVar30 + 0xb8))
                    (-(uint)(this_03->m_targetType != TEXTURETYPE_2D) | 0xde1,
                     (this_03->m_source).m_glTexture);
          pcVar32 = *(code **)(lVar30 + 0x1360);
          TVar3 = this_03->m_targetType;
          dVar20 = glu::getGLWrapMode(this_03->m_wrapS);
          (*pcVar32)(-(uint)(TVar3 != TEXTURETYPE_2D) | 0xde1,0x2802,dVar20);
          pcVar32 = *(code **)(lVar30 + 0x1360);
          TVar3 = this_03->m_targetType;
          dVar20 = glu::getGLWrapMode(this_03->m_wrapT);
          (*pcVar32)(-(uint)(TVar3 != TEXTURETYPE_2D) | 0xde1,0x2803,dVar20);
          pcVar32 = *(code **)(lVar30 + 0x1360);
          TVar3 = this_03->m_targetType;
          dVar20 = glu::getGLFilterMode(this_03->m_minFilter);
          (*pcVar32)(-(uint)(TVar3 != TEXTURETYPE_2D) | 0xde1,0x2801,dVar20);
          pcVar32 = *(code **)(lVar30 + 0x1360);
          TVar3 = this_03->m_targetType;
          dVar20 = glu::getGLFilterMode(this_03->m_magFilter);
          (*pcVar32)(-(uint)(TVar3 != TEXTURETYPE_2D) | 0xde1,0x2800,dVar20);
          (**(code **)(lVar30 + 0xb8))(-(uint)(this_03->m_targetType != TEXTURETYPE_2D) | 0xde1,0);
          SRGBTestTexture::setDecode(this_03,this_03->m_decoding);
        }
        __n = pSVar39;
        (*(pSVar39->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(pSVar39);
        iVar19 = (*(pSVar39->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])
                           (pSVar39);
        uVar35 = 0;
        while( true ) {
          ppSVar28 = (__n->m_shaderProgramList).
                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          ppSVar16 = (__n->m_shaderProgramList).
                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          if ((ulong)((long)ppSVar16 - (long)ppSVar28 >> 3) <= uVar35) break;
          pSVar22 = ppSVar28[uVar35];
          if (pSVar22 != (SRGBTestProgram *)0x0) {
            renderBufferTargets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            data_00._8_8_ = __n;
            data_00.ptr = in_stack_fffffffffffff788;
            de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
            assignData(&(pSVar22->m_program).
                        super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                       ,data_00);
            de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
            ~UniqueBase((UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *)
                        &renderBufferTargets);
            std::
            vector<deqp::gles31::Functional::(anonymous_namespace)::UniformData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>_>
            ::~vector(&pSVar22->m_uniformDataList);
            std::__cxx11::string::~string((string *)&pSVar22->m_shaderFragment);
            std::__cxx11::string::~string((string *)&pSVar22->m_shaderVertex);
            FragmentShaderParameters::~FragmentShaderParameters
                      (&pSVar22->m_shaderFragmentParameters);
            de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
            ~UniqueBase(&(pSVar22->m_program).
                         super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                       );
          }
          operator_delete(pSVar22,0xf8);
          uVar35 = uVar35 + 1;
        }
        if (ppSVar16 != ppSVar28) {
          (__n->m_shaderProgramList).
          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
          ._M_impl.super__Vector_impl_data._M_finish = ppSVar28;
        }
        this_04 = (__n->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
        if ((char)iVar19 == '\0') {
          tcu::TestContext::setTestResult(this_04,QP_TEST_RESULT_FAIL,"Result verification failed");
          return STOP;
        }
        tcu::TestContext::setTestResult(this_04,QP_TEST_RESULT_PASS,"Pass");
        local_864 = local_864 + TEXTURESAMPLING_TEXTURE_LOD;
      } while( true );
    }
    this_07 = (invalid_argument *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              ((TestError *)this_07,(char *)0x0,
               "gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSRGBDecodeTests.cpp"
               ,0x566);
    ppuVar34 = &tcu::TestError::typeinfo;
    pcVar32 = tcu::Exception::~Exception;
  }
  __cxa_throw(this_07,ppuVar34,pcVar32);
}

Assistant:

SRGBTestCase::IterateResult SRGBTestCase::iterate (void)
{
	bool	result;
	int		startIdx	= -1;
	int		endIdx		= -1;

	this->setupTest();

	if (m_samplingGroup == SHADERSAMPLINGGROUP_TEXTURE)
	{
		startIdx	= static_cast<int>(TEXTURESAMPLING_TEXTURE_START);
		endIdx		= static_cast<int>(TEXTURESAMPLING_TEXTURE_END);
	}
	else if (m_samplingGroup == SHADERSAMPLINGGROUP_TEXEL_FETCH)
	{
		startIdx	= static_cast<int>(TEXTURESAMPLING_TEXELFETCH_START);
		endIdx		= static_cast<int>(TEXTURESAMPLING_TEXELFETCH_END);
	}
	else
	{
		DE_FATAL("Error: Sampling group not defined");
	}

	this->initVertexData();
	this->initFrameBuffer();

	// loop through all sampling types in the required sampling group, performing individual tests for each
	for (int samplingTypeIdx = startIdx; samplingTypeIdx < endIdx; samplingTypeIdx++)
	{
		this->genShaderPrograms(static_cast<ShaderSamplingType>(samplingTypeIdx));
		this->uploadTextures();
		this->render();

		result = this->verifyResult();

		this->deleteShaderPrograms();

		if (result == true)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Result verification failed");
			return STOP;
		}
	}

	return STOP;
}